

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O2

Type * QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
       instance(void)

{
  int iVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_38;
  QMutexLocker<QBasicMutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      __cxa_atexit(QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                   ~ApplicationHolder,
                   &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                    ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                           ::instance()::holder);
    }
  }
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
      super___atomic_base<signed_char>._M_i != -1) {
    local_20.m_isLocked = true;
    local_20._9_7_ = 0xaaaaaaaaaaaaaa;
    local_20.m_mutex =
         &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex;
    QBasicMutex::lock(&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                       mutex);
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
        super___atomic_base<signed_char>._M_i == '\0') {
      latin1.m_data = "/networkaccess";
      latin1.m_size = 0xe;
      QString::QString((QString *)&local_38,latin1);
      QFactoryLoader::QFactoryLoader
                ((QFactoryLoader *)
                 &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                  storage,"org.qt-project.Qt.NetworkAccessBackendFactory",(QString *)&local_38,
                 CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      QObject::connect<void(QObject::*)(QObject*),void(&)()>
                ((Object *)&local_38,QCoreApplication::self,(ContextType *)QObject::destroyed,
                 (_func_void *)0x0,(ConnectionType)QCoreApplication::self);
      QMetaObject::Connection::~Connection((Connection *)&local_38);
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (Type *)&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                    storage;
  }
  __stack_chk_fail();
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }